

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

ByteCodeUsesInstr * IR::ByteCodeUsesInstr::New(Func *func,uint32 offset)

{
  ByteCodeUsesInstr *this;
  
  this = (ByteCodeUsesInstr *)new<Memory::JitArenaAllocator>(0x68,func->m_alloc,0x3eba5c);
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  (this->super_Instr).m_opcode = EndOfBlock;
  (this->super_Instr).ignoreOverflowBitCount = '\0';
  (this->super_Instr).dataWidth = '\0';
  (this->super_Instr).highlight = 0;
  *(undefined2 *)&(this->super_Instr).field_0x36 = 0;
  *(undefined8 *)&(this->super_Instr).field_0x38 = 0;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr).m_noLazyHelperAssert = false;
  *(undefined3 *)&(this->super_Instr).field_0x9 = 0;
  (this->super_Instr).bailOutByteCodeLocation = 0;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  this->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->propertySymUse = (PropertySym *)0x0;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  *(undefined2 *)&(this->super_Instr).field_0x36 = 0;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014d5720;
  Instr::Init((Instr *)this,ByteCodeUses,InstrKindByteCodeUses,func);
  this->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->propertySymUse = (PropertySym *)0x0;
  Instr::SetByteCodeOffset((Instr *)this,offset);
  return this;
}

Assistant:

ByteCodeUsesInstr *
ByteCodeUsesInstr::New(Func * func, uint32 offset)
{
    ByteCodeUsesInstr * byteCodeUses = JitAnew(func->m_alloc, IR::ByteCodeUsesInstr);
    byteCodeUses->Init(Js::OpCode::ByteCodeUses, InstrKindByteCodeUses, func);
    byteCodeUses->byteCodeUpwardExposedUsed = nullptr;
    byteCodeUses->propertySymUse = nullptr;
    byteCodeUses->SetByteCodeOffset(offset);
    return byteCodeUses;
}